

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall
ClipperLib::ClipperBase::SwapPositionsInAEL(ClipperBase *this,TEdge *Edge1,TEdge *Edge2)

{
  TEdge *pTVar1;
  TEdge *pTVar2;
  TEdge *Prev_2;
  TEdge *Next_2;
  TEdge *Prev_1;
  TEdge *Next_1;
  TEdge *Prev;
  TEdge *Next;
  TEdge *Edge2_local;
  TEdge *Edge1_local;
  ClipperBase *this_local;
  
  if ((Edge1->NextInAEL != Edge1->PrevInAEL) && (Edge2->NextInAEL != Edge2->PrevInAEL)) {
    if (Edge1->NextInAEL == Edge2) {
      pTVar1 = Edge2->NextInAEL;
      if (pTVar1 != (TEdge *)0x0) {
        pTVar1->PrevInAEL = Edge1;
      }
      pTVar2 = Edge1->PrevInAEL;
      if (pTVar2 != (TEdge *)0x0) {
        pTVar2->NextInAEL = Edge2;
      }
      Edge2->PrevInAEL = pTVar2;
      Edge2->NextInAEL = Edge1;
      Edge1->PrevInAEL = Edge2;
      Edge1->NextInAEL = pTVar1;
    }
    else if (Edge2->NextInAEL == Edge1) {
      pTVar1 = Edge1->NextInAEL;
      if (pTVar1 != (TEdge *)0x0) {
        pTVar1->PrevInAEL = Edge2;
      }
      pTVar2 = Edge2->PrevInAEL;
      if (pTVar2 != (TEdge *)0x0) {
        pTVar2->NextInAEL = Edge1;
      }
      Edge1->PrevInAEL = pTVar2;
      Edge1->NextInAEL = Edge2;
      Edge2->PrevInAEL = Edge1;
      Edge2->NextInAEL = pTVar1;
    }
    else {
      pTVar1 = Edge1->NextInAEL;
      pTVar2 = Edge1->PrevInAEL;
      Edge1->NextInAEL = Edge2->NextInAEL;
      if (Edge1->NextInAEL != (TEdge *)0x0) {
        Edge1->NextInAEL->PrevInAEL = Edge1;
      }
      Edge1->PrevInAEL = Edge2->PrevInAEL;
      if (Edge1->PrevInAEL != (TEdge *)0x0) {
        Edge1->PrevInAEL->NextInAEL = Edge1;
      }
      Edge2->NextInAEL = pTVar1;
      if (Edge2->NextInAEL != (TEdge *)0x0) {
        Edge2->NextInAEL->PrevInAEL = Edge2;
      }
      Edge2->PrevInAEL = pTVar2;
      if (Edge2->PrevInAEL != (TEdge *)0x0) {
        Edge2->PrevInAEL->NextInAEL = Edge2;
      }
    }
    if (Edge1->PrevInAEL == (TEdge *)0x0) {
      this->m_ActiveEdges = Edge1;
    }
    else if (Edge2->PrevInAEL == (TEdge *)0x0) {
      this->m_ActiveEdges = Edge2;
    }
  }
  return;
}

Assistant:

void ClipperBase::SwapPositionsInAEL(TEdge *Edge1, TEdge *Edge2)
{
  //check that one or other edge hasn't already been removed from AEL ...
  if (Edge1->NextInAEL == Edge1->PrevInAEL ||
    Edge2->NextInAEL == Edge2->PrevInAEL) return;

  if (Edge1->NextInAEL == Edge2)
  {
    TEdge* Next = Edge2->NextInAEL;
    if (Next) Next->PrevInAEL = Edge1;
    TEdge* Prev = Edge1->PrevInAEL;
    if (Prev) Prev->NextInAEL = Edge2;
    Edge2->PrevInAEL = Prev;
    Edge2->NextInAEL = Edge1;
    Edge1->PrevInAEL = Edge2;
    Edge1->NextInAEL = Next;
  }
  else if (Edge2->NextInAEL == Edge1)
  {
    TEdge* Next = Edge1->NextInAEL;
    if (Next) Next->PrevInAEL = Edge2;
    TEdge* Prev = Edge2->PrevInAEL;
    if (Prev) Prev->NextInAEL = Edge1;
    Edge1->PrevInAEL = Prev;
    Edge1->NextInAEL = Edge2;
    Edge2->PrevInAEL = Edge1;
    Edge2->NextInAEL = Next;
  }
  else
  {
    TEdge* Next = Edge1->NextInAEL;
    TEdge* Prev = Edge1->PrevInAEL;
    Edge1->NextInAEL = Edge2->NextInAEL;
    if (Edge1->NextInAEL) Edge1->NextInAEL->PrevInAEL = Edge1;
    Edge1->PrevInAEL = Edge2->PrevInAEL;
    if (Edge1->PrevInAEL) Edge1->PrevInAEL->NextInAEL = Edge1;
    Edge2->NextInAEL = Next;
    if (Edge2->NextInAEL) Edge2->NextInAEL->PrevInAEL = Edge2;
    Edge2->PrevInAEL = Prev;
    if (Edge2->PrevInAEL) Edge2->PrevInAEL->NextInAEL = Edge2;
  }

  if (!Edge1->PrevInAEL) m_ActiveEdges = Edge1;
  else if (!Edge2->PrevInAEL) m_ActiveEdges = Edge2;
}